

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

bool __thiscall QTextStreamPrivate::getChar(QTextStreamPrivate *this,QChar *ch)

{
  QString *pQVar1;
  long lVar2;
  long lVar3;
  QArrayData *data;
  qsizetype qVar4;
  qsizetype qVar5;
  void *pvVar6;
  void *pvVar7;
  DataPointer *pDVar8;
  Flags FVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  qsizetype *pqVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t *pcVar14;
  
  if ((this->string == (QString *)0x0) || (this->stringOffset != (this->string->d).size)) {
    if ((this->device != (QIODevice *)0x0) && ((this->readBuffer).d.size == 0)) {
      bVar10 = fillReadBuffer(this,-1);
      if (!bVar10) goto LAB_00304da8;
    }
    if (ch != (QChar *)0x0) {
      pQVar1 = this->string;
      pDVar8 = &pQVar1->d;
      if (pQVar1 == (QString *)0x0) {
        pDVar8 = &(this->readBuffer).d;
      }
      pcVar14 = pDVar8->ptr;
      pqVar13 = &this->readBufferOffset;
      if (pQVar1 != (QString *)0x0) {
        pqVar13 = &this->stringOffset;
      }
      if (pcVar14 == (char16_t *)0x0) {
        pcVar14 = L"";
      }
      ch->ucs = pcVar14[*pqVar13];
    }
    if (this->string == (QString *)0x0) {
      lVar3 = this->readBufferOffset;
      lVar2 = lVar3 + 1;
      this->readBufferOffset = lVar2;
      pQVar1 = &this->readBuffer;
      if (lVar2 < (this->readBuffer).d.size) {
        bVar10 = true;
        if (0x3fff < lVar3) {
          iVar11 = QString::remove(pQVar1,(char *)0x0);
          QString::operator=(pQVar1,(QString *)CONCAT44(extraout_var,iVar11));
          this->readConverterSavedStateOffset =
               this->readConverterSavedStateOffset + this->readBufferOffset;
          this->readBufferOffset = 0;
        }
      }
      else {
        this->readBufferOffset = 0;
        if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
          data = &((pQVar1->d).d)->super_QArrayData;
          (pQVar1->d).d = (Data *)0x0;
          (this->readBuffer).d.ptr = (char16_t *)0x0;
          (this->readBuffer).d.size = 0;
          if (data != (QArrayData *)0x0) {
            LOCK();
            (data->ref_)._q_value.super___atomic_base<int>._M_i =
                 (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(data,2,0x10);
            }
          }
        }
        iVar12 = (*(this->device->super_QObject)._vptr_QObject[0xf])();
        FVar9.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
        super_QFlagsStorage<QStringConverterBase::Flag>.i =
             (this->toUtf16).super_QStringConverter.state.flags.
             super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>;
        iVar11 = (this->toUtf16).super_QStringConverter.state.internalState;
        qVar4 = (this->toUtf16).super_QStringConverter.state.remainingChars;
        qVar5 = (this->toUtf16).super_QStringConverter.state.invalidChars;
        pvVar6 = (this->toUtf16).super_QStringConverter.state.field_4.d[0];
        pvVar7 = (this->toUtf16).super_QStringConverter.state.field_4.d[1];
        (this->savedToUtf16).super_QStringConverter.iface =
             (this->toUtf16).super_QStringConverter.iface;
        (this->savedToUtf16).super_QStringConverter.state.flags =
             (Flags)FVar9.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                    super_QFlagsStorage<QStringConverterBase::Flag>.i;
        (this->savedToUtf16).super_QStringConverter.state.internalState = iVar11;
        (this->savedToUtf16).super_QStringConverter.state.remainingChars = qVar4;
        (this->savedToUtf16).super_QStringConverter.state.invalidChars = qVar5;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[0] = pvVar6;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[1] = pvVar7;
        (this->savedToUtf16).super_QStringConverter.state.clearFn =
             (this->toUtf16).super_QStringConverter.state.clearFn;
        this->readBufferStartDevicePos = CONCAT44(extraout_var_00,iVar12);
        this->readConverterSavedStateOffset = 0;
        bVar10 = true;
      }
    }
    else {
      lVar2 = this->stringOffset;
      this->stringOffset = lVar2 + 1;
      lVar3 = (this->string->d).size;
      bVar10 = true;
      if (lVar3 <= lVar2) {
        this->stringOffset = lVar3;
      }
    }
  }
  else {
LAB_00304da8:
    if (ch != (QChar *)0x0) {
      ch->ucs = L'\0';
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

inline bool QTextStreamPrivate::getChar(QChar *ch)
{
    if ((string && stringOffset == string->size())
        || (device && readBuffer.isEmpty() && !fillReadBuffer())) {
        if (ch)
            *ch = QChar();
        return false;
    }
    if (ch)
        *ch = *readPtr();
    consume(1);
    return true;
}